

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O3

void __thiscall gv_visitor::visit(gv_visitor *this,AssignmentStatement *ptr)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"assignment stmt","");
  box(this,ptr,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  arrow(this,ptr,ptr->assignment);
  (**(ptr->assignment->super_Base)._vptr_Base)(ptr->assignment,this);
  return;
}

Assistant:

void gv_visitor::visit(AssignmentStatement* ptr) {
    box(ptr, "assignment stmt");
    arrow(ptr, ptr->assignment);
    ptr->assignment->accept(this);
}